

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCamera *camera
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_node_base *__lhs;
  Property *prop;
  _Base_ptr *this;
  double t;
  uint uVar1;
  pointer pSVar2;
  allocator aVar3;
  ostringstream oVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  ostream *poVar9;
  value_type *pvVar10;
  _Base_ptr p_Var11;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar12;
  value_type *value;
  size_type sVar13;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var14;
  Property *pPVar15;
  _Base_ptr p_Var16;
  string *__v;
  char *pcVar17;
  ulong uVar18;
  Property *args_1;
  long lVar19;
  undefined8 in_stack_fffffffffffffa78;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *target;
  ParseResult ret_9;
  allocator local_531;
  ParseResult ret;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4c8;
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> local_4b8
  ;
  TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *local_498;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *local_490;
  AttrMetas *local_488;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_3b8;
  _Any_data local_398;
  code *local_388;
  _Any_data local_378;
  code *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string attr_type_name;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  local_2f8 [11];
  string local_190;
  string local_170;
  string local_150 [32];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                    (uint)options->strict_allowedToken_check);
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&camera->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar5) {
    p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_488 = &(camera->clippingPlanes)._metas;
    local_498 = &camera->stereoRole;
    local_490 = &camera->projection;
    while( true ) {
      bVar5 = (_Rb_tree_header *)p_Var14 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar5) break;
      __lhs = p_Var14 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
      prop = (Property *)(p_Var14 + 2);
      ::std::__cxx11::string::string((string *)&ss_e,"focalLength",(allocator *)&ret_9);
      pPVar15 = (Property *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_50,prop,(string *)&ss_e,&camera->focalLength);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar6 = false;
        iVar8 = 3;
      }
      else {
        bVar6 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xeee);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_4b8);
          fmt::format<char[12],std::__cxx11::string>
                    ((string *)&ret_9,(fmt *)local_4d8,(string *)"focalLength",
                     (char (*) [12])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4d8,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar6 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar6) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"focusDistance",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_70,prop,(string *)&ss_e,&camera->focusDistance);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef0);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[14],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"focusDistance",
                       (char (*) [14])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"exposure",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_90,prop,(string *)&ss_e,&camera->exposure);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef1);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[9],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)0x487ca3,(char (*) [9])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_b0,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"fStop",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_b0,prop,(string *)&ss_e,&camera->fStop);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef2);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[6],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"fStop",(char (*) [6])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_d0,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"horizontalAperture",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_d0,prop,(string *)&ss_e,&camera->horizontalAperture);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef4);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[19],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"horizontalAperture",
                       (char (*) [19])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_f0,(string *)__lhs);
        ::std::__cxx11::string::string
                  ((string *)&ss_e,"horizontalApertureOffset",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_f0,prop,(string *)&ss_e,&camera->horizontalApertureOffset);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef6);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[25],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"horizontalApertureOffset",
                       (char (*) [25])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_110,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"verticalAperture",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_110,prop,(string *)&ss_e,&camera->verticalAperture);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xef8);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[17],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"verticalAperture",
                       (char (*) [17])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_130,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"verticalApertureOffset",(allocator *)&ret_9)
        ;
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_130,prop,(string *)&ss_e,&camera->verticalApertureOffset);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xefa);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[23],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"verticalApertureOffset",
                       (char (*) [23])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string(local_150,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"clippingRange",(allocator *)&ret_9);
        pPVar15 = prop;
        args_1 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_150,(string *)prop,(Property *)&ss_e,(string *)&camera->clippingRange,
                   target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xefc);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            pPVar15 = (Property *)&ret.err;
            fmt::format<char[14],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"clippingRange",
                       (char (*) [14])pPVar15,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_358,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&local_3b8,"clippingPlanes",&local_531);
        ret_9.err._M_dataplus._M_p = (pointer)&ret_9.err.field_2;
        ret_9.err._M_string_length = 0;
        ret_9.err.field_2._M_local_buf[0] = '\0';
        iVar8 = ::std::__cxx11::string::compare((string *)&local_358);
        if (iVar8 == 0) {
          if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            ret_9.code = PropertyTypeMismatch;
            ::std::__cxx11::string::string
                      ((string *)&ret,
                       "Property `{}` must be Attribute, but declared as Relationship.",
                       (allocator *)local_4d8);
            fmt::format<std::__cxx11::string>
                      ((string *)&ss_e,(fmt *)&ret,&local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            ::std::__cxx11::string::operator=((string *)&ret_9.err,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(camera->clippingPlanes)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var14[6]._M_parent);
            ret_9.code = Success;
          }
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
          tinyusdz::value::
          TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
          type_name_abi_cxx11_();
          _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ss_e,&attr_type_name);
          if (_Var7) {
            ::std::__cxx11::string::_M_dispose();
LAB_001c4ccc:
            iVar8 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
            if (iVar8 == 1) {
              bVar6 = Attribute::is_blocked((Attribute *)prop);
              if (bVar6) {
                (camera->clippingPlanes)._blocked = true;
              }
              this = &p_Var14[4]._M_parent;
              bVar6 = primvar::PrimVar::has_value((PrimVar *)this);
              if ((bVar6) || (p_Var14[5]._M_left != p_Var14[5]._M_parent)) {
                local_2f8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_2f8[0]._17_8_ = 0;
                local_2f8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2f8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                local_2f8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                local_308._M_allocated_capacity._0_2_ = 0;
                local_308._M_allocated_capacity._2_6_ = 0;
                local_308._8_2_ = 0;
                _ss_e = (pointer)0x0;
                bVar6 = primvar::PrimVar::is_valid((PrimVar *)this);
                if (bVar6) {
                  bVar6 = primvar::PrimVar::has_value((PrimVar *)this);
                  if (bVar6) {
                    primvar::PrimVar::
                    get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                              (&local_4b8,(PrimVar *)this);
                    bVar6 = local_4b8.has_value_;
                    local_4d8[0] = (allocator)local_4b8.has_value_;
                    if ((allocator)local_4b8.has_value_ == (allocator)0x1) {
                      local_4d8._8_8_ = local_4b8.contained.data.__align;
                      aStack_4c8._M_allocated_capacity = local_4b8.contained._8_8_;
                      aStack_4c8._8_8_ = local_4b8.contained._16_8_;
                      local_4b8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                      local_4b8.contained._8_8_ = 0;
                      local_4b8.contained._16_8_ = 0;
                      nonstd::optional_lite::
                      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                      ::~optional(&local_4b8);
                      pvVar10 = nonstd::optional_lite::
                                optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                ::value((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                         *)local_4d8);
                      Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                      ::set((Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                             *)&ss_e,pvVar10);
                    }
                    else {
                      nonstd::optional_lite::
                      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                      ::~optional(&local_4b8);
                    }
                    nonstd::optional_lite::
                    optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                    ::~optional((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                 *)local_4d8);
                    p_Var16 = p_Var14[5]._M_parent;
                    p_Var11 = p_Var14[5]._M_left;
                    if (p_Var11 == p_Var16) {
                      if ((allocator)bVar6 == (allocator)0x0) goto LAB_001c5174;
                    }
                    else {
LAB_001c4fbb:
                      lVar19 = 0;
                      for (uVar18 = 0; uVar18 < (ulong)(((long)p_Var11 - (long)p_Var16) / 0x28);
                          uVar18 = uVar18 + 1) {
                        pvVar12 = tinyusdz::value::TimeSamples::get_samples
                                            ((TimeSamples *)&p_Var14[5]._M_parent);
                        pSVar2 = (pvVar12->
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        if ((&pSVar2->blocked)[lVar19] == true) {
                          TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                          ::add_blocked_sample(local_2f8,*(double *)((long)&pSVar2->t + lVar19));
                        }
                        else {
                          tinyusdz::value::Value::
                          get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                    (&local_4b8,
                                     (Value *)((long)&(pSVar2->value).v_.storage + lVar19),false);
                          local_4d8[0] = (allocator)local_4b8.has_value_;
                          if ((allocator)local_4b8.has_value_ == (allocator)0x1) {
                            local_4d8._8_8_ = local_4b8.contained.data.__align;
                            aStack_4c8._M_allocated_capacity = local_4b8.contained._8_8_;
                            aStack_4c8._8_8_ = local_4b8.contained._16_8_;
                            local_4b8.contained.data.__align =
                                 (anon_struct_8_0_00000001_for___align)0x0;
                            local_4b8.contained._8_8_ = 0;
                            local_4b8.contained._16_8_ = 0;
                          }
                          nonstd::optional_lite::
                          optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                          ::~optional(&local_4b8);
                          aVar3 = local_4d8[0];
                          if (local_4d8[0] == (allocator)0x1) {
                            t = *(double *)((long)&pSVar2->t + lVar19);
                            pvVar10 = nonstd::optional_lite::
                                      optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                      ::value((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                               *)local_4d8);
                            TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                            ::add_sample(local_2f8,t,pvVar10);
                          }
                          else {
                            ret.err.field_2._M_allocated_capacity = 0;
                            ret.err.field_2._8_8_ = 0;
                            ret.err._M_dataplus._M_p = (pointer)0x0;
                            ret.err._M_string_length = 0;
                          }
                          nonstd::optional_lite::
                          optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                          ::~optional((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                       *)local_4d8);
                          if (aVar3 == (allocator)0x0) {
                            ret.code = ret.code & 0xffffff00;
                            goto LAB_001c5190;
                          }
                        }
                        p_Var16 = p_Var14[5]._M_parent;
                        p_Var11 = p_Var14[5]._M_left;
                        lVar19 = lVar19 + 0x28;
                      }
                      ret.code = ret.code & 0xffffff00;
                    }
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                    ::
                    optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>,_0>
                              ((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                *)&ret,(Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                        *)&ss_e);
                  }
                  else {
                    p_Var16 = p_Var14[5]._M_parent;
                    p_Var11 = p_Var14[5]._M_left;
                    if (p_Var11 != p_Var16) goto LAB_001c4fbb;
LAB_001c5174:
                    ret.code = ret.code & 0xffffff00;
                    ret.err.field_2._M_allocated_capacity = 0;
                    ret.err.field_2._8_8_ = 0;
                    ret.err._M_dataplus._M_p = (pointer)0x0;
                    ret.err._M_string_length = 0;
                  }
                }
                else {
                  ret.code = ret.code & 0xffffff00;
                  ret.err.field_2._M_allocated_capacity = 0;
                  ret.err.field_2._8_8_ = 0;
                  ret.err._M_dataplus._M_p = (pointer)0x0;
                  ret.err._M_string_length = 0;
                }
LAB_001c5190:
                Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                ::~Animatable((Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                               *)&ss_e);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                ::
                optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>,_0>
                          ((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                            *)&ss_e,(optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                     *)&ret);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                             *)&ret);
                oVar4 = ss_e;
                if (ss_e == (ostringstream)0x1) {
                  value = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                   *)&ss_e);
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                               *)&(camera->clippingPlanes)._attrib,value);
                }
                else {
                  ret_9.code = InternalError;
                  ::std::__cxx11::string::assign((char *)&ret_9.err);
                }
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                             *)&ss_e);
                if (oVar4 != (ostringstream)0x0) {
                  AttrMetas::operator=(local_488,(AttrMetas *)(p_Var14 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&table,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b8);
                  ret_9.code = Success;
                }
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001c5234;
              }
              if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
                AttrMetas::operator=(local_488,(AttrMetas *)(p_Var14 + 7));
                __v = (string *)&local_358;
                goto LAB_001c4d12;
              }
            }
            else if (iVar8 == 0) {
              (camera->clippingPlanes)._value_empty = true;
              AttrMetas::operator=(local_488,(AttrMetas *)(p_Var14 + 7));
              __v = &local_3b8;
LAB_001c4d12:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
              ret_9.code = Success;
            }
            else {
              ::std::__cxx11::string::assign((char *)&ret_9.err);
              ret_9.code = InternalError;
            }
          }
          else {
            tinyusdz::value::
            TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
            underlying_type_name_abi_cxx11_();
            _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (_Var7) goto LAB_001c4ccc;
            ret_9.code = TypeMismatch;
            ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)local_308._M_local_buf,"Property type mismatch. ")
            ;
            poVar9 = ::std::operator<<(poVar9,(string *)&local_3b8);
            poVar9 = ::std::operator<<(poVar9," expects type `");
            tinyusdz::value::
            TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
            type_name_abi_cxx11_();
            poVar9 = ::std::operator<<(poVar9,(string *)&ret);
            poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
            poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
            ::std::operator<<(poVar9,"`");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&ret_9.err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
          }
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ret_9.code = Unmatched;
        }
LAB_001c5234:
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret_9.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret_9.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xefe);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)&ret,(fmt *)local_4d8,(string *)"clippingPlanes",
                       (char (*) [15])&ret_9.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_170,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"shutter:open",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<double>
                  (&ret,&table,&local_170,prop,(string *)&ss_e,&camera->shutterOpen);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xeff);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[13],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"shutter:open",
                       (char (*) [13])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        ::std::__cxx11::string::string((string *)&local_190,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"shutter:close",(allocator *)&ret_9);
        pPVar15 = (Property *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<double>
                  (&ret,&table,&local_190,prop,(string *)&ss_e,&camera->shutterClose);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf01);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_4b8);
            fmt::format<char[14],std::__cxx11::string>
                      ((string *)&ret_9,(fmt *)local_4d8,(string *)"shutter:close",
                       (char (*) [14])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_9);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_9);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001c5d98;
        bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"projection");
        if (bVar6) {
          ::std::__cxx11::string::string((string *)&ss_e,"projection",(allocator *)&ret);
          sVar13 = ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar13 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&ret);
            if ((_Var7) && (uVar1 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar9 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf03);
                ::std::operator<<(poVar9," ");
                poVar9 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar9 = ::std::operator<<(poVar9,"projection");
                poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
                ::std::operator<<(poVar9,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret_9,err);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_490->_metas,(AttrMetas *)(p_Var14 + 7));
                pcVar17 = "projection";
LAB_001c5af5:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar17,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001c5da7;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = (pointer)0x0;
            local_308._8_2_ = 0x2222;
            local_308._10_6_ = 0x1e;
            local_308._M_allocated_capacity._0_2_ = 0x25e8;
            local_308._M_allocated_capacity._2_6_ = 0x1e;
            ::std::__cxx11::string::string((string *)&ret,"projection",(allocator *)&ret_9);
            bVar6 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_378,
                       (function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     err;
            bVar6 = ParseTimeSampledEnumProperty<tinyusdz::GeomCamera::Projection,tinyusdz::GeomCamera::Projection>
                              ((string *)&ret,bVar6,
                               (EnumHandlerFun<tinyusdz::GeomCamera::Projection> *)&local_378,
                               (Attribute *)prop,local_490,warn,err);
            if (local_368 != (code *)0x0) {
              (*local_368)(&local_378,&local_378,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar8 = 1;
            if (bVar6) {
              AttrMetas::operator=(&local_490->_metas,(AttrMetas *)(p_Var14 + 7));
              pcVar17 = "projection";
LAB_001c5d5f:
              ::std::__cxx11::string::string((string *)&ret,pcVar17,(allocator *)&ret_9);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar8 = 3;
            }
LAB_001c5d80:
            if ((code *)CONCAT62(local_308._M_allocated_capacity._2_6_,
                                 local_308._M_allocated_capacity._0_2_) != (code *)0x0) {
              (*(code *)CONCAT62(local_308._M_allocated_capacity._2_6_,
                                 local_308._M_allocated_capacity._0_2_))
                        ((Property *)&ss_e,(Property *)&ss_e,3);
            }
            goto LAB_001c5d98;
          }
        }
        else {
          bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"stereoRole");
          if (bVar6) {
            ::std::__cxx11::string::string((string *)&ss_e,"stereoRole",(allocator *)&ret);
            sVar13 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar13 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret);
              if ((_Var7) && (uVar1 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar9 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar9 = ::std::operator<<(poVar9,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar9 = ::std::operator<<(poVar9,":");
                  poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
                  poVar9 = ::std::operator<<(poVar9,"():");
                  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf05);
                  ::std::operator<<(poVar9," ");
                  poVar9 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar9 = ::std::operator<<(poVar9,"stereoRole");
                  poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar9,"\n");
                  if (warn != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&ret_9,err);
                    ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_498->_metas,(AttrMetas *)(p_Var14 + 7));
                  pcVar17 = "stereoRole";
                  goto LAB_001c5af5;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = (pointer)0x0;
              local_308._8_2_ = 0x2600;
              local_308._10_6_ = 0x1e;
              local_308._M_allocated_capacity._0_2_ = 0x29c6;
              local_308._M_allocated_capacity._2_6_ = 0x1e;
              ::std::__cxx11::string::string((string *)&ret,"stereoRole",(allocator *)&ret_9);
              bVar6 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_398,
                         (function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *
                       )err;
              bVar6 = ParseUniformEnumProperty<tinyusdz::GeomCamera::StereoRole,tinyusdz::GeomCamera::StereoRole>
                                ((string *)&ret,bVar6,
                                 (EnumHandlerFun<tinyusdz::GeomCamera::StereoRole> *)&local_398,
                                 (Attribute *)prop,local_498,warn,err);
              if (local_388 != (code *)0x0) {
                (*local_388)(&local_398,&local_398,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar8 = 1;
              if (bVar6) {
                AttrMetas::operator=(&local_498->_metas,(AttrMetas *)(p_Var14 + 7));
                pcVar17 = "stereoRole";
                goto LAB_001c5d5f;
              }
              goto LAB_001c5d80;
            }
          }
          else {
            sVar13 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)__lhs);
            if (sVar13 == 0) {
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&(camera->super_GPrim).props,(key_type *)__lhs);
              Property::operator=(this_00,prop);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
              ;
            }
            sVar13 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)__lhs);
            if (sVar13 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf07);
              ::std::operator<<(poVar9," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs);
              poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret_9,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              goto LAB_001c5edf;
            }
          }
        }
      }
      else {
LAB_001c5d98:
        if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_001c5ee7;
      }
LAB_001c5da7:
      p_Var14 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var14);
    }
    bVar5 = true;
  }
  else {
LAB_001c5edf:
    bVar5 = false;
  }
LAB_001c5ee7:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar5;
}

Assistant:

bool ReconstructPrim<GeomCamera>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCamera *camera,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)warn;
  (void)options;

  auto ProjectionHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::Projection, std::string> {
    using EnumTy = std::pair<GeomCamera::Projection, const char *>;
    constexpr std::array<EnumTy, 2> enums = {
        std::make_pair(GeomCamera::Projection::Perspective, "perspective"),
        std::make_pair(GeomCamera::Projection::Orthographic, "orthographic"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::Projection, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `projection` propety");
  };

  auto StereoRoleHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::StereoRole, std::string> {
    using EnumTy = std::pair<GeomCamera::StereoRole, const char *>;
    constexpr std::array<EnumTy, 3> enums = {
        std::make_pair(GeomCamera::StereoRole::Mono, "mono"),
        std::make_pair(GeomCamera::StereoRole::Left, "left"),
        std::make_pair(GeomCamera::StereoRole::Right, "right"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::StereoRole, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `stereoRole` propety");
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, camera, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "focalLength", GeomCamera, camera->focalLength)
    PARSE_TYPED_ATTRIBUTE(table, prop, "focusDistance", GeomCamera,
                   camera->focusDistance)
    PARSE_TYPED_ATTRIBUTE(table, prop, "exposure", GeomCamera, camera->exposure)
    PARSE_TYPED_ATTRIBUTE(table, prop, "fStop", GeomCamera, camera->fStop)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalAperture", GeomCamera,
                   camera->horizontalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalApertureOffset", GeomCamera,
                   camera->horizontalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalAperture", GeomCamera,
                   camera->verticalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalApertureOffset", GeomCamera,
                   camera->verticalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingRange", GeomCamera,
                   camera->clippingRange)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingPlanes", GeomCamera,
                   camera->clippingPlanes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:open", GeomCamera, camera->shutterOpen)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:close", GeomCamera,
                   camera->shutterClose)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "projection", GeomCamera::Projection, ProjectionHandler, GeomCamera,
                       camera->projection, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "stereoRole", GeomCamera::StereoRole, StereoRoleHandler, GeomCamera,
                       camera->stereoRole, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCamera, camera->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}